

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int mv_err_cost_(MV *mv,MV_COST_PARAMS *mv_cost_params)

{
  MV_COST_TYPE MVar1;
  int iVar2;
  short sVar3;
  int iVar4;
  short sVar5;
  MV local_c;
  
  MVar1 = mv_cost_params->mv_cost_type;
  iVar4 = 0;
  if (MVar1 != '\x04') {
    iVar2 = mv_cost_params->error_per_bit;
    local_c.row = (*mv).row - (*mv_cost_params->ref_mv).row;
    local_c.col = (*mv).col - (*mv_cost_params->ref_mv).col;
    sVar3 = -local_c.row;
    if (0 < local_c.row) {
      sVar3 = local_c.row;
    }
    sVar5 = -local_c.col;
    if (0 < local_c.col) {
      sVar5 = local_c.col;
    }
    if (MVar1 == '\x03') {
      iVar4 = (int)sVar5 + (int)sVar3 >> 3;
    }
    else if (MVar1 == '\x01') {
      iVar4 = (int)sVar5 + (int)sVar3 >> 2;
    }
    else {
      iVar4 = 0;
      if (MVar1 == '\0') {
        iVar4 = mv_cost(&local_c,mv_cost_params->mvjcost,mv_cost_params->mvcost);
        iVar4 = (int)((long)iVar4 * (long)iVar2 + 0x2000U >> 0xe);
      }
    }
  }
  return iVar4;
}

Assistant:

static inline int mv_err_cost_(const MV *mv,
                               const MV_COST_PARAMS *mv_cost_params) {
  if (mv_cost_params->mv_cost_type == MV_COST_NONE) {
    return 0;
  }
  return mv_err_cost(mv, mv_cost_params->ref_mv, mv_cost_params->mvjcost,
                     mv_cost_params->mvcost, mv_cost_params->error_per_bit,
                     mv_cost_params->mv_cost_type);
}